

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_node_min_angle(REF_GRID ref_grid,REF_INT node,REF_DBL *angle)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_NODE pRVar5;
  REF_CELL pRVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  REF_INT local_c8;
  REF_INT local_c4;
  REF_DBL local_c0;
  REF_INT local_b0;
  int local_ac;
  REF_INT local_a8;
  int local_a4;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dx2 [3];
  double local_78;
  REF_DBL dx1 [3];
  REF_DBL dot;
  REF_INT i;
  REF_INT node2;
  REF_INT cell2;
  REF_INT item2;
  REF_INT node1;
  REF_INT cell1;
  REF_INT item1;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *angle_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  pRVar5 = ref_grid->node;
  pRVar6 = ref_grid->cell[0];
  *angle = 180.0;
  if ((node < 0) || (pRVar6->ref_adj->nnode <= node)) {
    local_a4 = -1;
  }
  else {
    local_a4 = pRVar6->ref_adj->first[node];
  }
  node1 = local_a4;
  if (local_a4 == -1) {
    local_a8 = -1;
  }
  else {
    local_a8 = pRVar6->ref_adj->item[local_a4].ref;
  }
  item2 = local_a8;
  do {
    if (node1 == -1) {
      return 0;
    }
    if ((node < 0) || (pRVar6->ref_adj->nnode <= node)) {
      local_ac = -1;
    }
    else {
      local_ac = pRVar6->ref_adj->first[node];
    }
    node2 = local_ac;
    if (local_ac == -1) {
      local_b0 = -1;
    }
    else {
      local_b0 = pRVar6->ref_adj->item[local_ac].ref;
    }
    i = local_b0;
    while (node2 != -1) {
      if (item2 != i) {
        iVar1 = pRVar6->c2n[pRVar6->size_per * item2];
        iVar2 = pRVar6->c2n[pRVar6->size_per * item2 + 1];
        iVar3 = pRVar6->c2n[pRVar6->size_per * i];
        iVar4 = pRVar6->c2n[pRVar6->size_per * i + 1];
        for (dot._4_4_ = 0; dot._4_4_ < 3; dot._4_4_ = dot._4_4_ + 1) {
          dx1[(long)dot._4_4_ + -1] =
               pRVar5->real[dot._4_4_ + ((iVar1 + iVar2) - node) * 0xf] -
               pRVar5->real[dot._4_4_ + node * 0xf];
          *(double *)(&ref_private_macro_code_rss_1 + (long)dot._4_4_ * 2) =
               pRVar5->real[dot._4_4_ + ((iVar3 + iVar4) - node) * 0xf] -
               pRVar5->real[dot._4_4_ + node * 0xf];
        }
        uVar7 = ref_math_normalize(&local_78);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xa5c,"ref_geom_node_min_angle",(ulong)uVar7,"dx1");
          return uVar7;
        }
        uVar7 = ref_math_normalize((REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xa5d,"ref_geom_node_min_angle",(ulong)uVar7,"dx2");
          return uVar7;
        }
        dx1[2] = dx1[1] * dx2[1] + local_78 * _ref_private_macro_code_rss_1 + dx1[0] * dx2[0];
        dVar9 = *angle;
        dVar8 = acos(dx1[2]);
        if ((dVar8 * 180.0) / 3.14159265358979 <= dVar9) {
          dVar9 = acos(dx1[2]);
          local_c0 = (dVar9 * 180.0) / 3.14159265358979;
        }
        else {
          local_c0 = *angle;
        }
        *angle = local_c0;
      }
      node2 = pRVar6->ref_adj->item[node2].next;
      if (node2 == -1) {
        local_c4 = -1;
      }
      else {
        local_c4 = pRVar6->ref_adj->item[node2].ref;
      }
      i = local_c4;
    }
    node1 = pRVar6->ref_adj->item[node1].next;
    if (node1 == -1) {
      local_c8 = -1;
    }
    else {
      local_c8 = pRVar6->ref_adj->item[node1].ref;
    }
    item2 = local_c8;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_geom_node_min_angle(REF_GRID ref_grid,
                                                  REF_INT node,
                                                  REF_DBL *angle) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT item1, cell1, node1;
  REF_INT item2, cell2, node2;
  REF_INT i;
  REF_DBL dot, dx1[3], dx2[3];
  *angle = 180.0;
  each_ref_cell_having_node(ref_cell, node, item1, cell1) {
    each_ref_cell_having_node(ref_cell, node, item2, cell2) {
      if (cell1 == cell2) continue; /* skip same edge */
      node1 = ref_cell_c2n(ref_cell, 0, cell1) +
              ref_cell_c2n(ref_cell, 1, cell1) - node;
      node2 = ref_cell_c2n(ref_cell, 0, cell2) +
              ref_cell_c2n(ref_cell, 1, cell2) - node;
      for (i = 0; i < 3; i++) {
        dx1[i] =
            ref_node_xyz(ref_node, i, node1) - ref_node_xyz(ref_node, i, node);
        dx2[i] =
            ref_node_xyz(ref_node, i, node2) - ref_node_xyz(ref_node, i, node);
      }
      RSS(ref_math_normalize(dx1), "dx1");
      RSS(ref_math_normalize(dx2), "dx2");
      dot = ref_math_dot(dx1, dx2);
      *angle = MIN(*angle, ref_math_in_degrees(acos(dot)));
    }
  }
  return REF_SUCCESS;
}